

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::type_name(string *__return_storage_ptr__,
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *this)

{
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_local;
  
  local_18 = this;
  this_local = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)__return_storage_ptr__;
  switch(this->m_type) {
  case null:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case object:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"object",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case array:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"array",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case string:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case boolean:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"boolean",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"number",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case discarded:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"discarded",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const
		{
			{
				switch (m_type)
				{
				case value_t::null:
					return "null";
				case value_t::object:
					return "object";
				case value_t::array:
					return "array";
				case value_t::string:
					return "string";
				case value_t::boolean:
					return "boolean";
				case value_t::discarded:
					return "discarded";
				default:
					return "number";
				}
			}
		}